

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpassworddigestor.cpp
# Opt level: O3

QByteArray *
QPasswordDigestor::deriveKeyPbkdf2
          (QByteArray *__return_storage_ptr__,Algorithm algorithm,QByteArray *data,QByteArray *salt,
          int iterations,quint64 dkLen)

{
  Data *pDVar1;
  int *piVar2;
  QArrayData *pQVar3;
  char *pcVar4;
  qsizetype qVar5;
  QDebug QVar6;
  char *pcVar7;
  int iVar8;
  iterator pcVar9;
  storage_type *psVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QMessageAuthenticationCode hmac;
  QArrayData *local_d8;
  char *pcStack_d0;
  storage_type *local_c8;
  QByteArray local_c0;
  QDebug local_a8;
  char *pcStack_a0;
  storage_type *local_98;
  undefined1 *local_90;
  QByteArray local_88;
  char *local_70;
  QDebug local_60;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = QCryptographicHash::hashLength(algorithm);
  uVar12 = ((long)iVar8 << 0x20) + (long)iVar8 * -2;
  if (uVar12 < dkLen) {
    local_88.d.d._0_4_ = 2;
    local_88.d.d._4_4_ = 0;
    local_88.d.ptr._0_4_ = 0;
    local_88.d.ptr._4_4_ = 0;
    local_88.d.size._0_4_ = 0;
    local_88.d.size._4_4_ = 0;
    local_70 = "default";
    QMessageLogger::warning();
    pDVar1 = local_c0.d.d;
    *(undefined1 *)&local_c0.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i = 0
    ;
    QVar16.m_data = (storage_type *)0x16;
    QVar16.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)pDVar1,(QString *)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_c0.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
       ) {
      QTextStream::operator<<((QTextStream *)local_c0.d.d,' ');
    }
    local_60.stream = (Stream *)local_c0.d.d;
    *(int *)&local_c0.d.d[2].super_QArrayData.alloc =
         (int)local_c0.d.d[2].super_QArrayData.alloc + 1;
    qt_QMetaEnum_debugOperator
              (&local_a8,(longlong)&local_60,(QMetaObject *)(ulong)algorithm,
               (char *)&QCryptographicHash::staticMetaObject);
    QVar6.stream = local_a8.stream;
    QVar17.m_data = (storage_type *)0x2c;
    QVar17.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_a8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_a8.stream,uVar12);
    if ((char)(((QArrayData *)(local_a8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QVar6.stream = local_a8.stream;
    QVar18.m_data = (storage_type *)0x5;
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_a8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_a8.stream,dkLen);
    if ((char)(((QArrayData *)(local_a8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QVar6.stream = local_a8.stream;
    QVar19.m_data = (storage_type *)0xf;
    QVar19.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_a8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug((QDebug *)&local_c0);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (iterations < 1 || dkLen == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_001c9704;
    }
    local_88.d.d._0_4_ = 0;
    local_88.d.d._4_4_ = 0;
    local_88.d.ptr._0_4_ = 0;
    local_88.d.ptr._4_4_ = 0;
    local_88.d.size._0_4_ = 0;
    local_88.d.size._4_4_ = 0;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QVar20.m_data = (data->d).ptr;
    QVar20.m_size = (data->d).size;
    QMessageAuthenticationCode::QMessageAuthenticationCode
              ((QMessageAuthenticationCode *)&local_90,algorithm,QVar20);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_58,4,Uninitialized);
    uVar12 = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
    if (uVar12 < dkLen) {
      uVar11 = 1;
      do {
        QVar13.m_data = (storage_type *)(salt->d).size;
        QVar13.m_size = (qsizetype)&local_90;
        QMessageAuthenticationCode::addData(QVar13);
        if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
        }
        *(uint *)local_58.d.ptr =
             uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
        QVar14.m_data = (storage_type *)local_58.d.size;
        QVar14.m_size = (qsizetype)&local_90;
        QMessageAuthenticationCode::addData(QVar14);
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        QMessageAuthenticationCode::result();
        QMessageAuthenticationCode::reset();
        local_c0.d.d = (Data *)local_a8.stream;
        local_c0.d.ptr = pcStack_a0;
        local_c0.d.size = (qsizetype)local_98;
        if ((QArrayData *)local_a8.stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a8.stream = *(int *)local_a8.stream + 1;
          UNLOCK();
        }
        if (1 < (uint)iterations) {
          iVar8 = 1;
          do {
            psVar10 = local_c8;
            pQVar3 = local_d8;
            QVar15.m_data = local_98;
            QVar15.m_size = (qsizetype)&local_90;
            QMessageAuthenticationCode::addData(QVar15);
            QMessageAuthenticationCode::result();
            pcVar4 = pcStack_a0;
            QVar6.stream = local_a8.stream;
            local_d8 = (QArrayData *)local_a8.stream;
            local_a8.stream = (Stream *)pQVar3;
            pcStack_a0 = pcStack_d0;
            pcStack_d0 = pcVar4;
            local_c8 = local_98;
            local_98 = psVar10;
            if ((QArrayData *)QVar6.stream != (QArrayData *)0x0) {
              LOCK();
              *(int *)QVar6.stream = *(int *)QVar6.stream + -1;
              UNLOCK();
              if (*(int *)QVar6.stream == 0) {
                QArrayData::deallocate((QArrayData *)QVar6.stream,1,0x10);
              }
            }
            QMessageAuthenticationCode::reset();
            pcVar7 = pcStack_a0;
            qVar5 = local_c0.d.size;
            pcVar4 = local_c0.d.ptr;
            pcVar9 = QByteArray::begin(&local_c0);
            if ((storage_type *)qVar5 != (storage_type *)0x0) {
              psVar10 = (storage_type *)0x0;
              do {
                pcVar9[(long)psVar10] = pcVar7[(long)psVar10] ^ pcVar4[(long)psVar10];
                psVar10 = psVar10 + 1;
              } while ((storage_type *)qVar5 != psVar10);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 != iterations);
        }
        QByteArray::append(&local_88);
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_a8.stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a8.stream = *(int *)local_a8.stream + -1;
          UNLOCK();
          if (*(int *)local_a8.stream == 0) {
            QArrayData::deallocate((QArrayData *)local_a8.stream,1,0x10);
          }
        }
        uVar11 = uVar11 + 1;
        uVar12 = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
      } while (uVar12 < dkLen);
    }
    if (dkLen < uVar12) {
      QByteArray::QByteArray
                (__return_storage_ptr__,(char *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_),
                 dkLen);
    }
    else {
      pDVar1 = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (char *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
      (__return_storage_ptr__->d).size = uVar12;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    QMessageAuthenticationCode::~QMessageAuthenticationCode((QMessageAuthenticationCode *)&local_90)
    ;
    piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),1,0x10)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001c9704:
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QByteArray deriveKeyPbkdf2(QCryptographicHash::Algorithm algorithm,
                                            const QByteArray &data, const QByteArray &salt,
                                            int iterations, quint64 dkLen)
{
    // The RFC recommends checking that 'dkLen' is not greater than '(2^32 - 1) * hLen'
    int hashLen = QCryptographicHash::hashLength(algorithm);
    const quint64 maxLen = quint64(std::numeric_limits<quint32>::max() - 1) * hashLen;
    if (dkLen > maxLen) {
        qWarning().nospace() << "Derived key too long:\n"
                             << algorithm << " was chosen which produces output of length "
                             << maxLen << " but " << dkLen << " was requested.";
        return QByteArray();
    }

    if (iterations < 1 || dkLen < 1)
        return QByteArray();

#ifdef USING_OPENSSL30
    if (methodToName(algorithm))
        return opensslDeriveKeyPbkdf2(algorithm, data, salt, iterations, dkLen);
#endif

    // https://tools.ietf.org/html/rfc8018#section-5.2
    QByteArray key;
    quint32 currentIteration = 1;
    QMessageAuthenticationCode hmac(algorithm, data);
    QByteArray index(4, Qt::Uninitialized);
    while (quint64(key.size()) < dkLen) {
        hmac.addData(salt);

        qToBigEndian(currentIteration, index.data());
        hmac.addData(index);

        QByteArray u = hmac.result();
        hmac.reset();
        QByteArray tkey = u;
        for (int iter = 1; iter < iterations; iter++) {
            hmac.addData(u);
            u = hmac.result();
            hmac.reset();
            std::transform(tkey.cbegin(), tkey.cend(), u.cbegin(), tkey.begin(),
                           std::bit_xor<char>());
        }
        key += tkey;
        currentIteration++;
    }
    return key.left(dkLen);
}